

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void arimatest(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  arima_object obj;
  int N;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auStack_4b38 [8];
  double temp2 [1200];
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e6.dat","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    N = 0;
    if (iVar1 == 0) {
      uVar2 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf %lf \n",(long)temp2 + uVar2 + 0x2578,auStack_4b38 + uVar2);
        iVar1 = feof(__stream);
        uVar2 = uVar2 + 8;
        N = N + 1;
      } while (iVar1 == 0);
      inp = (double *)malloc(uVar2 & 0x7fffffff8);
      memcpy(inp,temp2 + 0x4af,uVar2 & 0x7fffffff8);
    }
    else {
      inp = (double *)malloc(0);
    }
    lVar3 = 0;
    obj = arima_init(1,0,1,N);
    arima_setMethod(obj,0);
    arima_setOptMethod(obj,7);
    arima_exec(obj,inp);
    arima_summary(obj);
    arima_predict(obj,inp,5,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",xpred[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    lVar3 = 0;
    printf("Standard Errors  : ");
    do {
      dVar4 = amse[lVar3];
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      printf("%g ",dVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    arima_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void arimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	double *phi, *theta;
	double *xpred, *amse;
	arima_object obj;
	p = 1;
	d = 0;
	q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/e6.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf \n", &temp[i],&temp2[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = arima_init(p, d, q, N);
	arima_setMethod(obj, 0); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	arima_setOptMethod(obj, 7);// Method 7 ("BFGS with More Thuente Line search") is default so this step is unnecessary. The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	arima_exec(obj, inp);
	arima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	arima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	arima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(xpred);
	free(amse);
}